

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsBoolToBoolean(bool value,JsValueRef *booleanValue)

{
  anon_class_16_2_6117ca8f fn;
  JsErrorCode JVar1;
  JsValueRef *local_18;
  JsValueRef *booleanValue_local;
  bool value_local;
  
  fn.booleanValue = &local_18;
  fn.value = (bool *)((long)&booleanValue_local + 7);
  local_18 = booleanValue;
  booleanValue_local._7_1_ = value;
  JVar1 = ContextAPINoScriptWrapper<JsBoolToBoolean::__0>(fn,true,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsBoolToBoolean(_In_ bool value, _Out_ JsValueRef *booleanValue)
{
    return ContextAPINoScriptWrapper([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTCreateBoolean, value);

        PARAM_NOT_NULL(booleanValue);

        *booleanValue = value ? scriptContext->GetLibrary()->GetTrue() : scriptContext->GetLibrary()->GetFalse();

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, booleanValue);

        return JsNoError;
    },
    /*allowInObjectBeforeCollectCallback*/true);
}